

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O0

Gia_Man_t * Gia_ManRebuild(Gia_Man_t *p,Dsd_Manager_t *pManDsd,DdManager *ddNew)

{
  Dsd_Node_t **p_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *vFanins_00;
  Vec_Str_t *vSop_00;
  Vec_Str_t *vCube_00;
  Dsd_Node_t *pDVar3;
  Vec_Int_t *vFanins;
  Vec_Str_t *vCube;
  Vec_Str_t *vSop;
  int local_48;
  int iLit;
  int nNodesDsd;
  int i;
  Dsd_Node_t *pNodeDsd;
  Dsd_Node_t **ppNodesDsd;
  Gia_Man_t *pNew;
  DdManager *ddNew_local;
  Dsd_Manager_t *pManDsd_local;
  Gia_Man_t *p_local;
  
  vSop._4_4_ = -1;
  pNew = (Gia_Man_t *)ddNew;
  ddNew_local = (DdManager *)pManDsd;
  pManDsd_local = (Dsd_Manager_t *)p;
  vFanins_00 = Vec_IntAlloc(1000);
  vSop_00 = Vec_StrAlloc(10000);
  vCube_00 = Vec_StrAlloc(1000);
  iVar1 = Gia_ManObjNum((Gia_Man_t *)pManDsd_local);
  ppNodesDsd = (Dsd_Node_t **)Gia_ManStart(iVar1 << 1);
  pDVar3 = (Dsd_Node_t *)Abc_UtilStrsav((char *)pManDsd_local->dd);
  *ppNodesDsd = pDVar3;
  pDVar3 = (Dsd_Node_t *)Abc_UtilStrsav((char *)pManDsd_local->Table);
  ppNodesDsd[1] = pDVar3;
  Gia_ManHashAlloc((Gia_Man_t *)ppNodesDsd);
  pDVar3 = Dsd_ManagerReadConst1((Dsd_Manager_t *)ddNew_local);
  Dsd_NodeSetMark(pDVar3,1);
  for (iLit = 0; iVar1 = iLit, iVar2 = Gia_ManCiNum((Gia_Man_t *)pManDsd_local), iVar1 < iVar2;
      iLit = iLit + 1) {
    pDVar3 = Dsd_ManagerReadInput((Dsd_Manager_t *)ddNew_local,iLit);
    _nNodesDsd = pDVar3;
    iVar1 = Gia_ManAppendCi((Gia_Man_t *)ppNodesDsd);
    Dsd_NodeSetMark(pDVar3,iVar1);
  }
  pNodeDsd = (Dsd_Node_t *)Dsd_TreeCollectNodesDfs((Dsd_Manager_t *)ddNew_local,&local_48);
  iLit = 0;
  while ((iLit < local_48 &&
         (vSop._4_4_ = Gia_ManRebuildNode((Dsd_Manager_t *)ddNew_local,
                                          *(Dsd_Node_t **)(&pNodeDsd->Type + (long)iLit * 2),
                                          (Gia_Man_t *)ppNodesDsd,(DdManager *)pNew,vFanins_00,
                                          vSop_00,vCube_00), vSop._4_4_ != -1))) {
    iLit = iLit + 1;
  }
  if (pNodeDsd != (Dsd_Node_t *)0x0) {
    free(pNodeDsd);
    pNodeDsd = (Dsd_Node_t *)0x0;
  }
  Vec_IntFree(vFanins_00);
  Vec_StrFree(vSop_00);
  Vec_StrFree(vCube_00);
  if (vSop._4_4_ == -1) {
    Gia_ManStop((Gia_Man_t *)ppNodesDsd);
    p_local = Gia_ManDup((Gia_Man_t *)pManDsd_local);
  }
  else {
    for (iLit = 0; iVar1 = iLit, iVar2 = Gia_ManCoNum((Gia_Man_t *)pManDsd_local), p_00 = ppNodesDsd
        , iVar1 < iVar2; iLit = iLit + 1) {
      _nNodesDsd = Dsd_ManagerReadRoot((Dsd_Manager_t *)ddNew_local,iLit);
      iVar1 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)_nNodesDsd & 0xfffffffffffffffe));
      iVar1 = Abc_LitNotCond(iVar1,(uint)_nNodesDsd & 1);
      Gia_ManAppendCo((Gia_Man_t *)ppNodesDsd,iVar1);
    }
    iVar1 = Gia_ManRegNum((Gia_Man_t *)pManDsd_local);
    Gia_ManSetRegNum((Gia_Man_t *)p_00,iVar1);
    p_local = (Gia_Man_t *)ppNodesDsd;
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManRebuild( Gia_Man_t * p, Dsd_Manager_t * pManDsd, DdManager * ddNew )
{
    Gia_Man_t * pNew;
    Dsd_Node_t ** ppNodesDsd;
    Dsd_Node_t * pNodeDsd;
    int i, nNodesDsd, iLit = -1;
    Vec_Str_t * vSop, * vCube;
    Vec_Int_t * vFanins;

    vFanins = Vec_IntAlloc( 1000 );
    vSop    = Vec_StrAlloc( 10000 );
    vCube   = Vec_StrAlloc( 1000 );

    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );

    // save the CI nodes in the DSD nodes
    Dsd_NodeSetMark( Dsd_ManagerReadConst1(pManDsd), 1 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadInput( pManDsd, i );
        Dsd_NodeSetMark( pNodeDsd, Gia_ManAppendCi( pNew ) );
    }

    // collect DSD nodes in DFS order (leaves and const1 are not collected)
    ppNodesDsd = Dsd_TreeCollectNodesDfs( pManDsd, &nNodesDsd );
    for ( i = 0; i < nNodesDsd; i++ )
    {
        iLit = Gia_ManRebuildNode( pManDsd, ppNodesDsd[i], pNew, ddNew, vFanins, vSop, vCube );
        if ( iLit == -1 )
            break;
    }
    ABC_FREE( ppNodesDsd );
    Vec_IntFree( vFanins );
    Vec_StrFree( vSop );
    Vec_StrFree( vCube );
    if ( iLit == -1 )
    {
        Gia_ManStop( pNew );
        return Gia_ManDup(p);
    }

    // set the pointers to the CO drivers
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadRoot( pManDsd, i );
        iLit = Dsd_NodeReadMark( Dsd_Regular(pNodeDsd) );
        iLit = Abc_LitNotCond( iLit, Dsd_IsComplement(pNodeDsd) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}